

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,deque<int,_void,_void> *args,
          list<int,_void> *args_1,slist<int,_void> *args_2,vector<int,_void,_void> *args_3)

{
  header_holder_type *phVar1;
  header_holder_plus_last_t *phVar2;
  QueueWriter *this_00;
  char **ppcVar3;
  ulong uVar4;
  int *piVar5;
  Queue *pQVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  node_ptr psVar11;
  int *piVar12;
  node_ptr plVar13;
  header_holder_plus_last_t hVar14;
  index_pointer ppiVar15;
  int *piVar16;
  char *pcVar17;
  int *piVar18;
  const_iterator __end0_1;
  size_t __n;
  const_iterator __end0;
  long lVar19;
  long lVar20;
  size_t sizes [6];
  long local_68 [7];
  
  local_68[0] = 8;
  local_68[1] = 8;
  piVar12 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start.
            m_cur;
  piVar5 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_finish.
           m_cur;
  if (piVar12 == piVar5) {
    local_68[2] = 4;
  }
  else {
    ppiVar15 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start
               .m_node;
    piVar18 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start.
              m_first;
    piVar16 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start.
              m_last;
    local_68[2] = 4;
    do {
      piVar12 = piVar12 + 1;
      if (piVar12 == piVar16) {
        piVar12 = ppiVar15[1];
        ppiVar15 = ppiVar15 + 1;
        piVar16 = (int *)(((long)piVar16 - (long)piVar18) + (long)piVar12);
        piVar18 = piVar12;
      }
      local_68[2] = local_68[2] + 4;
    } while (piVar12 != piVar5);
  }
  phVar1 = &(args_1->
            super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
            ).m_icont.data_.root_plus_size_.m_header;
  local_68[3] = 0;
  plVar13 = &phVar1->super_node;
  do {
    plVar13 = ((node *)&plVar13->next_)->next_;
    local_68[3] = local_68[3] + 4;
  } while (plVar13 != &phVar1->super_node);
  phVar2 = &(args_2->
            super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
            ).m_icont.data_.root_plus_size_.super_header_holder_plus_last_t;
  local_68[4] = 0;
  hVar14.header_holder_.super_node.next_ =
       (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)
       (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)phVar2;
  do {
    hVar14.header_holder_.super_node.next_ =
         *(default_header_holder<boost::intrusive::slist_node_traits<void_*>_> *)
          hVar14.header_holder_.super_node.next_;
    local_68[4] = local_68[4] + 4;
  } while (hVar14.header_holder_.super_node.next_ !=
           (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)phVar2);
  local_68[5] = (args_3->m_holder).m_size * 4 + 4;
  lVar19 = 0;
  lVar20 = 0;
  lVar9 = 0;
  do {
    lVar19 = lVar19 + local_68[lVar9];
    lVar20 = lVar20 + local_68[lVar9 + 1];
    lVar9 = lVar9 + 2;
  } while (lVar9 != 6);
  uVar4 = lVar20 + lVar19 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar4) &&
       (sVar10 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar10 < uVar4)) &&
      (replaceChannel(this,uVar4),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar4)) &&
     (sVar10 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar10 < uVar4)) {
    bVar7 = false;
  }
  else {
    *(int *)(this->_qw)._writePos = (int)(lVar20 + lVar19);
    pcVar17 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar17 + 4;
    *(uint64_t *)(pcVar17 + 4) = eventSourceId;
    pcVar17 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar17 + 8;
    *(uint64_t *)(pcVar17 + 8) = clock;
    ppcVar3 = &(this->_qw)._writePos;
    *ppcVar3 = *ppcVar3 + 8;
    mserialize::detail::BuiltinSerializer<boost::container::deque<int,_void,_void>,_void>::
    serialize<binlog::detail::QueueWriter>(args,this_00);
    *(int *)(this->_qw)._writePos =
         (int)(args_1->
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
              ).m_icont.data_.root_plus_size_.super_size_traits.size_;
    ppcVar3 = &(this->_qw)._writePos;
    *ppcVar3 = *ppcVar3 + 4;
    for (plVar13 = (args_1->
                   super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
                   ).m_icont.data_.root_plus_size_.m_header.super_node.next_;
        plVar13 != &phVar1->super_node; plVar13 = plVar13->next_) {
      *(undefined4 *)(this->_qw)._writePos = *(undefined4 *)&plVar13[1].next_;
      ppcVar3 = &(this->_qw)._writePos;
      *ppcVar3 = *ppcVar3 + 4;
    }
    *(int *)(this->_qw)._writePos =
         (int)(args_2->
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
              ).m_icont.data_.root_plus_size_.super_size_traits.size_;
    ppcVar3 = &(this->_qw)._writePos;
    *ppcVar3 = *ppcVar3 + 4;
    for (psVar11 = (args_2->
                   super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
                   ).m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.
                   super_node.next_; (header_holder_plus_last_t *)psVar11 != phVar2;
        psVar11 = psVar11->next_) {
      *(undefined4 *)(this->_qw)._writePos = *(undefined4 *)&psVar11[1].next_;
      ppcVar3 = &(this->_qw)._writePos;
      *ppcVar3 = *ppcVar3 + 4;
    }
    uVar4 = (args_3->m_holder).m_size;
    iVar8 = (int)uVar4;
    *(int *)(this->_qw)._writePos = iVar8;
    pcVar17 = (this->_qw)._writePos + 4;
    (this->_qw)._writePos = pcVar17;
    if (iVar8 != 0) {
      __n = (uVar4 & 0xffffffff) * 4;
      memcpy(pcVar17,(args_3->m_holder).m_start,__n);
      ppcVar3 = &(this->_qw)._writePos;
      *ppcVar3 = *ppcVar3 + __n;
    }
    pQVar6 = (this->_qw)._queue;
    (pQVar6->writeIndex).super___atomic_base<unsigned_long>._M_i =
         (long)(this->_qw)._writePos - (long)pQVar6->buffer;
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}